

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

bool ReplaceMenu(FScanner *sc,FMenuDescriptor *desc)

{
  FMenuDescriptor *pFVar1;
  undefined4 in_EAX;
  FMenuDescriptor **ppFVar2;
  FName local_18;
  FName local_14;
  
  _local_18 = CONCAT44((desc->mMenuName).Index,in_EAX);
  ppFVar2 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            CheckKey(&MenuDescriptors,&local_14);
  if ((ppFVar2 != (FMenuDescriptor **)0x0) && (pFVar1 = *ppFVar2, pFVar1 != (FMenuDescriptor *)0x0))
  {
    if ((pFVar1->mClass != (PClass *)0x0) && (pFVar1->mClass != desc->mClass)) {
      FScanner::ScriptMessage
                (sc,"Tried to replace menu \'%s\' with a menu of different type",
                 FName::NameData.NameArray[(desc->mMenuName).Index].Text);
      return true;
    }
    (*pFVar1->_vptr_FMenuDescriptor[1])();
  }
  _local_18 = CONCAT44(local_14.Index,(desc->mMenuName).Index);
  ppFVar2 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            operator[](&MenuDescriptors,&local_18);
  *ppFVar2 = desc;
  return false;
}

Assistant:

static bool ReplaceMenu(FScanner &sc, FMenuDescriptor *desc)
{
	FMenuDescriptor **pOld = MenuDescriptors.CheckKey(desc->mMenuName);
	if (pOld != NULL && *pOld != NULL) 
	{
		if (CheckCompatible(desc, *pOld))
		{
			delete *pOld;
		}
		else
		{
			sc.ScriptMessage("Tried to replace menu '%s' with a menu of different type", desc->mMenuName.GetChars());
			return true;
		}
	}
	MenuDescriptors[desc->mMenuName] = desc;
	return false;
}